

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

void __thiscall
cnn::HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder
          (HierarchicalSoftmaxBuilder *this,uint rep_dim,string *cluster_file,Dict *word_dict,
          Model *model)

{
  Cluster *pCVar1;
  FactoredSoftmaxBuilder *in_RDI;
  Model *in_stack_000000f0;
  uint in_stack_000000fc;
  Cluster *in_stack_00000100;
  Dict *in_stack_00000310;
  string *in_stack_00000318;
  HierarchicalSoftmaxBuilder *in_stack_00000320;
  Dict *this_00;
  
  FactoredSoftmaxBuilder::FactoredSoftmaxBuilder(in_RDI);
  in_RDI->_vptr_FactoredSoftmaxBuilder = (_func_int **)&PTR_new_graph_008fc018;
  this_00 = (Dict *)(in_RDI + 1);
  std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::vector
            ((vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *)0x5ea49c);
  Dict::Dict(this_00);
  pCVar1 = ReadClusterFile(in_stack_00000320,in_stack_00000318,in_stack_00000310);
  in_RDI[0x10]._vptr_FactoredSoftmaxBuilder = (_func_int **)pCVar1;
  Cluster::initialize(in_stack_00000100,in_stack_000000fc,in_stack_000000f0);
  return;
}

Assistant:

HierarchicalSoftmaxBuilder::HierarchicalSoftmaxBuilder(unsigned rep_dim,
                             const std::string& cluster_file,
                             Dict* word_dict,
                             Model* model) {
  root = ReadClusterFile(cluster_file, word_dict);
  root->initialize(rep_dim, model);
}